

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O2

void __thiscall
ruckig::PositionThirdOrderStep1::time_acc0_acc1
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax,bool return_after_found)

{
  Profile *pPVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined4 in_EAX;
  undefined4 extraout_EAX;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar19 = aMax - aMin;
  auVar10._0_8_ =
       (this->af_p4 * aMax - this->a0_p4 * aMin) * 3.0 +
       (aMax * -6.0 * this->a0_a0 +
       aMin * 6.0 * this->af_af + (this->a0_p3 - this->af_p3) * 8.0 + aMax * 3.0 * aMin * dVar19) *
       aMax * aMin +
       ((((aMax - (this->a0 + this->a0)) * this->v0 - (aMin - (this->af + this->af)) * this->vf) *
         aMax * aMin + this->a0_a0 * aMin * this->v0) - this->af_af * aMax * this->vf) * jMax * 12.0
  ;
  auVar10._8_8_ =
       ((this->vf_vf * aMax - this->v0_v0 * aMin) - (aMin + aMin) * aMax * this->pd) * 4.0;
  auVar8._0_8_ = dVar19 * 3.0 * this->jMax_jMax;
  auVar8._8_8_ = dVar19;
  auVar8 = divpd(auVar10,auVar8);
  dVar19 = auVar8._8_8_ + auVar8._0_8_;
  if (dVar19 < 0.0) {
    return;
  }
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
    in_EAX = extraout_EAX;
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  dVar19 = dVar19 * 0.5;
  auVar16._8_8_ = aMax;
  auVar16._0_8_ = aMin;
  auVar9._0_8_ = -this->af_af;
  dVar14 = -dVar19;
  auVar15._8_8_ = dVar19;
  auVar15._0_8_ = dVar14;
  auVar16 = divpd(auVar15,auVar16);
  auVar12._0_8_ = aMin - (aMax + aMax);
  auVar12._8_8_ = aMax - (aMin + aMin);
  auVar6._8_8_ = this->v0;
  auVar6._0_8_ = this->a0_a0;
  auVar13._8_8_ = aMax;
  auVar13._0_8_ = (aMax + aMax) * jMax;
  auVar8 = divpd(auVar6,auVar13);
  auVar9._8_8_ = this->vf;
  auVar3._8_8_ = aMin;
  auVar3._0_8_ = (aMin + aMin) * jMax;
  auVar10 = divpd(auVar9,auVar3);
  auVar2._8_8_ = jMax + jMax;
  auVar2._0_8_ = jMax + jMax;
  auVar13 = divpd(auVar12,auVar2);
  dVar11 = (auVar10._0_8_ - auVar13._8_8_) + auVar10._8_8_;
  dVar18 = (auVar13._0_8_ + auVar8._0_8_) - auVar8._8_8_;
  dVar17 = auVar16._8_8_;
  auVar7._8_8_ = -(ulong)(dVar17 < dVar18);
  auVar7._0_8_ = -(ulong)(auVar16._0_8_ < dVar11);
  iVar5 = movmskpd(in_EAX,auVar7);
  if (iVar5 == 3) {
    pPVar1 = *profile;
    (pPVar1->t)._M_elems[0] = (aMax - this->a0) / jMax;
    (pPVar1->t)._M_elems[1] = dVar18 - dVar17;
    (pPVar1->t)._M_elems[2] = aMax / jMax;
    (pPVar1->t)._M_elems[3] = 0.0;
    (pPVar1->t)._M_elems[4] = -aMin / jMax;
    (pPVar1->t)._M_elems[5] = dVar19 / aMin + dVar11;
    (pPVar1->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
    bVar4 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                      (pPVar1,jMax,vMax,vMin,aMax,aMin);
    if (bVar4) {
      add_profile(this,profile);
      if (dVar18 <= dVar14 / aMax || return_after_found) {
        return;
      }
      goto LAB_001614f8;
    }
  }
  if (dVar18 <= dVar14 / aMax) {
    return;
  }
LAB_001614f8:
  if (dVar19 / aMin < dVar11) {
    pPVar1 = *profile;
    (pPVar1->t)._M_elems[0] = (aMax - this->a0) / jMax;
    (pPVar1->t)._M_elems[1] = dVar17 + dVar18;
    (pPVar1->t)._M_elems[2] = aMax / jMax;
    (pPVar1->t)._M_elems[3] = 0.0;
    (pPVar1->t)._M_elems[4] = -aMin / jMax;
    (pPVar1->t)._M_elems[5] = dVar11 - dVar19 / aMin;
    (pPVar1->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
    bVar4 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                      (pPVar1,jMax,vMax,vMin,aMax,aMin);
    if (bVar4) {
      add_profile(this,profile);
      return;
    }
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_acc0_acc1(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax, bool return_after_found) const {
    double h1 = (3*(af_p4*aMax - a0_p4*aMin) + aMax*aMin*(8*(a0_p3 - af_p3) + 3*aMax*aMin*(aMax - aMin) + 6*aMin*af_af - 6*aMax*a0_a0) + 12*jMax*(aMax*aMin*((aMax - 2*a0)*v0 - (aMin - 2*af)*vf) + aMin*a0_a0*v0 - aMax*af_af*vf))/(3*(aMax - aMin)*jMax_jMax) + 4*(aMax*vf_vf - aMin*v0_v0 - 2*aMin*aMax*pd)/(aMax - aMin);

    if (h1 >= 0) {
        h1 = std::sqrt(h1) / 2;
        const double h2 = a0_a0/(2*aMax*jMax) + (aMin - 2*aMax)/(2*jMax) - v0/aMax;
        const double h3 = -af_af/(2*aMin*jMax) - (aMax - 2*aMin)/(2*jMax) + vf/aMin;

        // UDDU: Solution 2
        if (h2 > h1/aMax && h3 > -h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 - h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 + h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
                if (return_after_found) {
                    return;
                }
            }
        }

        // UDDU: Solution 1
        if (h2 > -h1/aMax && h3 > h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 + h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 - h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
            }
        }
    }
}